

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzquadraticline.cpp
# Opt level: O3

void pzgeom::TPZQuadraticLine::TShape<Fad<double>>
               (TPZVec<Fad<double>_> *loc,TPZFMatrix<Fad<double>_> *phi,
               TPZFMatrix<Fad<double>_> *dphi)

{
  uint uVar1;
  Fad<double> *pFVar2;
  undefined1 auVar3 [16];
  int iVar4;
  double *pdVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  Fad<double> qsi;
  Fad<double> local_a8;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  local_88;
  FadExpr<FadBinaryMul<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *local_78;
  double local_70;
  double dStack_68;
  Fad<double> *local_60;
  undefined1 *local_58;
  FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> local_50;
  long lVar14;
  
  pFVar2 = loc->fStore;
  local_a8.val_ = pFVar2->val_;
  uVar1 = (pFVar2->dx_).num_elts;
  local_a8.dx_.ptr_to_data = (double *)0x0;
  local_a8.dx_.num_elts = uVar1;
  if ((long)(int)uVar1 != 0) {
    uVar9 = 0xffffffffffffffff;
    if (-1 < (int)uVar1) {
      uVar9 = (long)(int)uVar1 << 3;
    }
    local_a8.dx_.ptr_to_data = (double *)operator_new__(uVar9);
    MEM_CPY<double>::copy
              ((MEM_CPY<double> *)local_a8.dx_.ptr_to_data,(EVP_PKEY_CTX *)(pFVar2->dx_).ptr_to_data
               ,(EVP_PKEY_CTX *)(ulong)uVar1);
  }
  local_a8.defaultVal = pFVar2->defaultVal;
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
  local_78 = &local_88;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_58 = (undefined1 *)&local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_58 = (undefined1 *)&local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  Fad<double>::operator=
            (phi->fElem,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryMin<Fad<double>_>_>,_FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)&local_78);
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 2.0;
  dStack_68 = 0.0;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
    local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
    local_78 = &local_88;
    local_58 = (undefined1 *)&local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_88.fadexpr_.left_ = (FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_> *)&local_58;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_50;
  local_78 = &local_88;
  local_58 = (undefined1 *)&local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  Fad<double>::operator=
            (phi->fElem + 1,
             (FadExpr<FadBinaryDiv<FadExpr<FadBinaryMul<FadExpr<FadUnaryPlus<Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadCst<double>_>_>
              *)&local_78);
  local_50.fadexpr_.left_.constant_ = 1.0;
  local_50.fadexpr_.left_.defaultVal = 0.0;
  local_70 = 1.0;
  dStack_68 = 0.0;
  local_88.fadexpr_.left_ = &local_50;
  local_88.fadexpr_.right_ = (FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_> *)&local_78;
  if (((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 3) ||
     ((phi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    local_60 = &local_a8;
    local_50.fadexpr_.right_ = &local_a8;
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  local_60 = &local_a8;
  local_50.fadexpr_.right_ = &local_a8;
  Fad<double>::operator=(phi->fElem + 2,&local_88);
  iVar4 = local_a8.dx_.num_elts;
  if (((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  uVar9 = (ulong)(uint)local_a8.dx_.num_elts;
  uVar1 = (pFVar2->dx_).num_elts;
  if (local_a8.dx_.num_elts == uVar1) {
    if (local_a8.dx_.num_elts != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
LAB_00f9ed48:
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
    }
  }
  else if (local_a8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      (pFVar2->dx_).num_elts = 0;
      (pFVar2->dx_).ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      (pFVar2->dx_).ptr_to_data = (double *)0x0;
    }
    (pFVar2->dx_).num_elts = iVar4;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar6 = uVar9 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    (pFVar2->dx_).ptr_to_data = pdVar5;
    auVar3 = _DAT_014d28c0;
    if (local_a8.dx_.num_elts != 0) goto LAB_00f9ed48;
    if (0 < iVar4) {
      lVar7 = uVar9 - 1;
      auVar10._8_4_ = (int)lVar7;
      auVar10._0_8_ = lVar7;
      auVar10._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar10 = auVar10 ^ _DAT_014d28c0;
      auVar16 = _DAT_014d28b0;
      do {
        auVar15 = auVar16 ^ auVar3;
        if ((bool)(~(auVar15._4_4_ == auVar10._4_4_ && auVar10._0_4_ < auVar15._0_4_ ||
                    auVar10._4_4_ < auVar15._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_a8.defaultVal;
        }
        if ((auVar15._12_4_ != auVar10._12_4_ || auVar15._8_4_ <= auVar10._8_4_) &&
            auVar15._12_4_ <= auVar10._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_a8.defaultVal;
        }
        lVar8 = auVar16._8_8_;
        auVar16._0_8_ = auVar16._0_8_ + 2;
        auVar16._8_8_ = lVar8 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar4 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar4 = local_a8.dx_.num_elts;
  pFVar2->val_ = local_a8.val_ + -0.5;
  lVar7 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar7 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem + lVar7;
  uVar9 = (ulong)(uint)local_a8.dx_.num_elts;
  uVar1 = dphi->fElem[lVar7].dx_.num_elts;
  if (local_a8.dx_.num_elts == uVar1) {
    if (local_a8.dx_.num_elts != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
LAB_00f9eefb:
      if (0 < iVar4) {
        uVar6 = 0;
        do {
          pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8);
          uVar6 = uVar6 + 1;
        } while (uVar9 != uVar6);
      }
    }
  }
  else if (local_a8.dx_.num_elts == 0) {
    if (uVar1 != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      (pFVar2->dx_).num_elts = 0;
      (pFVar2->dx_).ptr_to_data = (double *)0x0;
    }
  }
  else {
    if (uVar1 != 0) {
      pdVar5 = (pFVar2->dx_).ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      (pFVar2->dx_).ptr_to_data = (double *)0x0;
    }
    (pFVar2->dx_).num_elts = iVar4;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar6 = uVar9 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    (pFVar2->dx_).ptr_to_data = pdVar5;
    auVar3 = _DAT_014d28c0;
    if (local_a8.dx_.num_elts != 0) goto LAB_00f9eefb;
    if (0 < iVar4) {
      lVar7 = uVar9 - 1;
      auVar11._8_4_ = (int)lVar7;
      auVar11._0_8_ = lVar7;
      auVar11._12_4_ = (int)((ulong)lVar7 >> 0x20);
      lVar7 = 0;
      auVar11 = auVar11 ^ _DAT_014d28c0;
      auVar15 = _DAT_014d28b0;
      do {
        auVar16 = auVar15 ^ auVar3;
        if ((bool)(~(auVar16._4_4_ == auVar11._4_4_ && auVar11._0_4_ < auVar16._0_4_ ||
                    auVar11._4_4_ < auVar16._4_4_) & 1)) {
          *(double *)((long)pdVar5 + lVar7) = local_a8.defaultVal;
        }
        if ((auVar16._12_4_ != auVar11._12_4_ || auVar16._8_4_ <= auVar11._8_4_) &&
            auVar16._12_4_ <= auVar11._12_4_) {
          *(double *)((long)pdVar5 + lVar7 + 8) = local_a8.defaultVal;
        }
        lVar8 = auVar15._8_8_;
        auVar15._0_8_ = auVar15._0_8_ + 2;
        auVar15._8_8_ = lVar8 + 2;
        lVar7 = lVar7 + 0x10;
      } while ((ulong)(iVar4 + 1U >> 1) << 4 != lVar7);
    }
  }
  iVar4 = local_a8.dx_.num_elts;
  pFVar2->val_ = local_a8.val_ + 0.5;
  lVar7 = (dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar7 < 1) || ((dphi->super_TPZMatrix<Fad<double>_>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<Fad<double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pFVar2 = dphi->fElem;
  uVar9 = (ulong)(uint)local_a8.dx_.num_elts;
  uVar1 = pFVar2[lVar7 * 2].dx_.num_elts;
  if (local_a8.dx_.num_elts == uVar1) {
    if (local_a8.dx_.num_elts == 0) goto LAB_00f9f1be;
    pdVar5 = pFVar2[lVar7 * 2].dx_.ptr_to_data;
  }
  else {
    if (local_a8.dx_.num_elts == 0) {
      if (uVar1 != 0) {
        pdVar5 = pFVar2[lVar7 * 2].dx_.ptr_to_data;
        if (pdVar5 != (double *)0x0) {
          operator_delete__(pdVar5);
        }
        pFVar2[lVar7 * 2].dx_.num_elts = 0;
        pFVar2[lVar7 * 2].dx_.ptr_to_data = (double *)0x0;
      }
      goto LAB_00f9f1be;
    }
    if (uVar1 != 0) {
      pdVar5 = pFVar2[lVar7 * 2].dx_.ptr_to_data;
      if (pdVar5 != (double *)0x0) {
        operator_delete__(pdVar5);
      }
      pFVar2[lVar7 * 2].dx_.ptr_to_data = (double *)0x0;
    }
    pFVar2[lVar7 * 2].dx_.num_elts = iVar4;
    uVar6 = 0xffffffffffffffff;
    if (-1 < iVar4) {
      uVar6 = uVar9 * 8;
    }
    pdVar5 = (double *)operator_new__(uVar6);
    pFVar2[lVar7 * 2].dx_.ptr_to_data = pdVar5;
    auVar3 = _DAT_014d28c0;
    if (local_a8.dx_.num_elts == 0) {
      if (0 < iVar4) {
        lVar8 = uVar9 - 1;
        auVar12._8_4_ = (int)lVar8;
        auVar12._0_8_ = lVar8;
        auVar12._12_4_ = (int)((ulong)lVar8 >> 0x20);
        lVar8 = 0;
        auVar12 = auVar12 ^ _DAT_014d28c0;
        auVar13 = _DAT_014d28b0;
        do {
          auVar16 = auVar13 ^ auVar3;
          if ((bool)(~(auVar16._4_4_ == auVar12._4_4_ && auVar12._0_4_ < auVar16._0_4_ ||
                      auVar12._4_4_ < auVar16._4_4_) & 1)) {
            *(double *)((long)pdVar5 + lVar8) = local_a8.defaultVal * -2.0;
          }
          if ((auVar16._12_4_ != auVar12._12_4_ || auVar16._8_4_ <= auVar12._8_4_) &&
              auVar16._12_4_ <= auVar12._12_4_) {
            *(double *)((long)pdVar5 + lVar8 + 8) = local_a8.defaultVal * -2.0;
          }
          lVar14 = auVar13._8_8_;
          auVar13._0_8_ = auVar13._0_8_ + 2;
          auVar13._8_8_ = lVar14 + 2;
          lVar8 = lVar8 + 0x10;
        } while ((ulong)(iVar4 + 1U >> 1) << 4 != lVar8);
      }
      goto LAB_00f9f1be;
    }
  }
  if (0 < iVar4) {
    uVar6 = 0;
    do {
      pdVar5[uVar6] = *(double *)((long)local_a8.dx_.ptr_to_data + uVar6 * 8) * -2.0;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar6);
  }
LAB_00f9f1be:
  pFVar2[lVar7 * 2].val_ = local_a8.val_ * -2.0;
  Fad<double>::~Fad(&local_a8);
  return;
}

Assistant:

void TPZQuadraticLine::TShape(const TPZVec<T> &loc,TPZFMatrix<T> &phi,TPZFMatrix<T> &dphi) {
    
    T qsi = loc[0];
    
    phi(0,0)  = -qsi*(1.-qsi)/2.;
    phi(1,0)  = +qsi*(1.+qsi)/2.;
    phi(2,0)  = (1.-qsi)*(1.+qsi);
    
    dphi(0,0) = qsi-0.5;
    dphi(0,1) = qsi+0.5;
    dphi(0,2) = -2.*qsi;
}